

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O0

void DrawRectangleInWindow(WINDOW *win,int x,int y,int width,int height)

{
  int iVar1;
  undefined4 local_28;
  undefined4 local_24;
  int i_1;
  int i;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  WINDOW *win_local;
  
  iVar1 = wmove(win,y,x);
  if (iVar1 != -1) {
    waddch(win,_DAT_0010b238);
  }
  iVar1 = wmove(win,y,x + width);
  if (iVar1 != -1) {
    waddch(win,_DAT_0010b234);
  }
  iVar1 = wmove(win,y + height,x);
  if (iVar1 != -1) {
    waddch(win,_DAT_0010b23c);
  }
  iVar1 = wmove(win,y + height,x + width);
  if (iVar1 != -1) {
    waddch(win,_DAT_0010b230);
  }
  for (local_24 = 1; local_24 < height; local_24 = local_24 + 1) {
    iVar1 = wmove(win,y + local_24,x);
    if (iVar1 != -1) {
      waddch(win,_DAT_0010b268);
    }
    iVar1 = wmove(win,y + local_24,x + width);
    if (iVar1 != -1) {
      waddch(win,_DAT_0010b268);
    }
  }
  for (local_28 = 1; local_28 < width; local_28 = local_28 + 1) {
    iVar1 = wmove(win,y,x + local_28);
    if (iVar1 != -1) {
      waddch(win,_DAT_0010b24c);
    }
    iVar1 = wmove(win,y + height,x + local_28);
    if (iVar1 != -1) {
      waddch(win,_DAT_0010b24c);
    }
  }
  return;
}

Assistant:

static void DrawRectangleInWindow(WINDOW* win,
                                  int x,
                                  int y,
                                  int width,
                                  int height)
{
  mvwaddch(win, y, x, ACS_ULCORNER);
  mvwaddch(win, y, x + width, ACS_URCORNER);
  mvwaddch(win, y + height, x, ACS_LLCORNER);
  mvwaddch(win, y + height, x + width, ACS_LRCORNER);

  for (int i = 1; i < height; i++) {
    mvwaddch(win, y + i, x, ACS_VLINE);
    mvwaddch(win, y + i, x + width, ACS_VLINE);
  }

  for (int i = 1; i < width; i++) {
    mvwaddch(win, y, x + i, ACS_HLINE);
    mvwaddch(win, y + height, x + i, ACS_HLINE);
  }
}